

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconvert.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  size_t sVar2;
  unkbyte10 in_ST0;
  size_t len;
  char conversion [10];
  uint high_nibble_2;
  uint i_5;
  uint i_4;
  uint high_nibble_1;
  uint i_3;
  uint i_2;
  uint high_nibble;
  uint i_1;
  uint i;
  int exp;
  uchar flt80_byte [16];
  byte bStack_2e;
  byte bStack_2d;
  uchar dbl_byte [8];
  uchar flt_byte [4];
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  unique0x1000085b = argv;
  if ((argc < 2) || (3 < argc)) {
    puts("Usage: fpconvert <floating-point> [<conversion>]");
    argv_local._4_4_ = 1;
  }
  else {
    flt.value = strtof(argv[1],(char **)0x0);
    dbl.value = strtod(stack0xffffffffffffffd8[1],(char **)0x0);
    strtold(stack0xffffffffffffffd8[1],(char **)0x0);
    flt80._0_8_ = (undefined8)in_ST0;
    flt80._8_2_ = (undefined2)((unkuint10)in_ST0 >> 0x40);
    dbl_byte._0_4_ = flt;
    stack0xffffffffffffffcc = dbl;
    _i = flt80._0_8_;
    flt80_byte._2_6_ = flt80._10_6_;
    flt80_byte._0_2_ = flt80._8_2_;
    puts("------------------- float --------------------");
    printf("Bits: %zu\n",0x20);
    printf("Hex:  %02x%02x.%02x%02x.\n",(ulong)dbl_byte[3],(ulong)dbl_byte[2],(ulong)dbl_byte[1],
           (ulong)dbl_byte[0]);
    for (high_nibble = 0; high_nibble < 4; high_nibble = high_nibble + 1) {
      if (dbl_byte[high_nibble] != flt.byte[high_nibble]) {
        __assert_fail("flt_byte[ i ] == flt.byte[ i ]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/auxiliary/fpconvert/fpconvert.c"
                      ,0x74,"int main(int, char **)");
      }
    }
    printf("Bin:  seee.eeee.efff.ffff.ffff.ffff.ffff.ffff.\n      ");
    for (i_2 = 4; i_2 != 0; i_2 = i_2 - 1) {
      printf("%s.%s.",nibbles[(uint)((int)(dbl_byte[i_2 - 1] & 0xf0) >> 4)],
             nibbles[(int)(dbl_byte[i_2 - 1] & 0xf)]);
    }
    puts("");
    uVar1 = ((uint)dbl_byte._0_4_ >> 0x18 & 0x7f) << 1 | (uint)dbl_byte._0_4_ >> 0x17 & 1;
    printf("Exp:  %#x      Unbiased: %d\n",(ulong)uVar1,(ulong)(uVar1 - 0x7f));
    puts("------------------ double --------------------");
    printf("Bits: %zu\n",0x40);
    printf("Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",(ulong)stack0xffffffffffffffcc >> 0x38,
           (ulong)stack0xffffffffffffffcc >> 0x30 & 0xff,
           (ulong)stack0xffffffffffffffcc >> 0x28 & 0xff,
           (ulong)stack0xffffffffffffffcc >> 0x20 & 0xff,
           (ulong)stack0xffffffffffffffcc >> 0x18 & 0xff,(uint)flt80_byte[0xe],
           (ushort)flt80_byte[0xd],(uint)flt80_byte[0xc]);
    for (high_nibble_1 = 0; high_nibble_1 < 8; high_nibble_1 = high_nibble_1 + 1) {
      if (flt80_byte[(ulong)high_nibble_1 + 0xc] != dbl.byte[high_nibble_1]) {
        __assert_fail("dbl_byte[ i ] == dbl.byte[ i ]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/auxiliary/fpconvert/fpconvert.c"
                      ,0x90,"int main(int, char **)");
      }
    }
    printf("Bin:  seee.eeee.eeee.ffff.ffff.ffff.ffff.ffff.\n      ");
    for (i_4 = 8; i_4 != 0; i_4 = i_4 - 1) {
      printf("%s.%s.",nibbles[(uint)((int)(flt80_byte[(ulong)(i_4 - 1) + 0xc] & 0xf0) >> 4)],
             nibbles[(int)(flt80_byte[(ulong)(i_4 - 1) + 0xc] & 0xf)]);
      if ((1 < i_4) && ((i_4 & 3) == 1)) {
        printf("\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      ");
      }
    }
    puts("");
    uVar1 = (bStack_2d & 0x7f) << 4 | (uint)(bStack_2e >> 4);
    printf("Exp:  %#x      Unbiased: %d\n",(ulong)uVar1,(ulong)(uVar1 - 0x3ff));
    puts("------------------ float80 -------------------");
    printf("Bits: %zu (48 unused, 80 encoded)\n",0x80);
    printf("Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",
           (ulong)flt80_byte._0_8_ >> 8 & 0xff,flt80_byte._0_8_ & 0xff,_i >> 0x38,_i >> 0x30 & 0xff,
           _i >> 0x28 & 0xff,(uint)(byte)exp,(ushort)i._3_1_,(uint)i._2_1_,(uint)i._1_1_,
           (uint)(byte)i);
    for (high_nibble_2 = 0; high_nibble_2 < 0x10; high_nibble_2 = high_nibble_2 + 1) {
      if (*(uchar *)((long)&i + (ulong)high_nibble_2) != flt80.byte[high_nibble_2]) {
        __assert_fail("flt80_byte[ i ] == flt80.byte[ i ]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/auxiliary/fpconvert/fpconvert.c"
                      ,0xb1,"int main(int, char **)");
      }
    }
    printf("Bin:  seee.eeee.eeee.eeee.\n      ");
    conversion[6] = '\n';
    conversion[7] = '\0';
    conversion[8] = '\0';
    conversion[9] = '\0';
    for (; conversion._6_4_ != 0; conversion._6_4_ = conversion._6_4_ + -1) {
      uVar1 = (int)(*(byte *)((long)&i + (ulong)(conversion._6_4_ - 1)) & 0xf0) >> 4;
      conversion[2] = (char)uVar1;
      conversion[3] = (char)(uVar1 >> 8);
      conversion[4] = (char)(uVar1 >> 0x10);
      conversion[5] = (char)(uVar1 >> 0x18);
      printf("%s.%s.",nibbles[uVar1],
             nibbles[(int)(*(byte *)((long)&i + (ulong)(conversion._6_4_ - 1)) & 0xf)]);
      if (conversion._6_4_ == 9) {
        printf("\n      ifff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      ");
      }
      if (conversion._6_4_ == 5) {
        printf("\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      ");
      }
    }
    puts("");
    uVar1 = (flt80_byte[1] & 0x7f) << 8 | (uint)flt80_byte[0];
    printf("Exp:  %#x      Unbiased: %d\n",(ulong)uVar1,(ulong)(uVar1 - 0x3fff));
    printf("Dec:  %d\n",(ulong)((exp._3_1_ & 0x80) == 0x80));
    puts("----------------------------------------------");
    if (argc == 3) {
      stack0xffffffffffffff86 = 0x25;
      conversion[0] = '\0';
      conversion[1] = '\0';
      if (*stack0xffffffffffffffd8[2] == '%') {
        stack0xffffffffffffffd8[2] = stack0xffffffffffffffd8[2] + 1;
      }
      sVar2 = strlen(stack0xffffffffffffffd8[2]);
      if (sVar2 < 9) {
        strcat((char *)((long)&len + 6),stack0xffffffffffffffd8[2]);
        strcat((char *)((long)&len + 6),"\n");
        strtod(stack0xffffffffffffffd8[1],(char **)0x0);
        printf((char *)((long)&len + 6));
        sVar2 = strlen((char *)((long)&len + 6));
        *(undefined1 *)((long)&len + sVar2 + 7) = *(undefined1 *)((long)&len + sVar2 + 6);
        *(undefined2 *)((long)&len + sVar2 + 5) = *(undefined2 *)((long)&len + sVar2 + 4);
        *(undefined1 *)((long)&len + sVar2 + 4) = 0x4c;
        strtold(stack0xffffffffffffffd8[1],(char **)0x0);
        printf((char *)((long)&len + 6));
      }
      else {
        puts("Conversion too long (8 characters max)");
        argv_local._4_4_ = 1;
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char * argv[] )
{
    unsigned char    flt_byte[ sizeof( float ) ];
    unsigned char    dbl_byte[ sizeof( double ) ];
#ifdef FLOAT80
    unsigned char  flt80_byte[ sizeof( long double ) ];
#endif
#ifdef FLOAT128
    unsigned char flt128_byte[ sizeof( float128_t ) ];
#endif

    int exp;

    if ( argc < 2 || argc > 3 )
    {
        puts( "Usage: fpconvert <floating-point> [<conversion>]" );
        return 1;
    }

    flt.value    =    strtof( argv[1], NULL );
    dbl.value    =    strtod( argv[1], NULL );
#ifdef FLOAT80
    flt80.value  =   strtold( argv[1], NULL );
#endif
#ifdef FLOAT128
    flt128.value = strtof128( argv[1], NULL );
#endif

    memcpy(    flt_byte,    &flt.value, sizeof( float ) );
    memcpy(    dbl_byte,    &dbl.value, sizeof( double ) );
#ifdef FLOAT80
    memcpy(  flt80_byte,  &flt80.value, sizeof( long double ) );
#endif
#ifdef FLOAT128
    memcpy( flt128_byte, &flt128.value, sizeof( float128_t ) );
#endif

    puts( "------------------- float --------------------" );

    printf( "Bits: %zu\n", sizeof( float ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.\n", flt_byte[ 3 ], flt_byte[ 2 ], flt_byte[ 1 ], flt_byte[ 0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( float ); ++i )
    {
        assert( flt_byte[ i ] == flt.byte[ i ] );
    }

    /* Printing binary dump of whole register */
    printf( "Bin:  seee.eeee.efff.ffff.ffff.ffff.ffff.ffff.\n      " );

    for ( unsigned i = sizeof( float ); i > 0; --i )
    {
        unsigned high_nibble = ( flt_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ flt_byte[ i - 1 ] & 0x0f ] );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)flt_byte[3] & 0x7f ) << 1 ) | ( (unsigned)flt_byte[2] >> 7 );

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_FLT_BIAS );

    puts( "------------------ double --------------------" );

    printf( "Bits: %zu\n", sizeof( double ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.\n", dbl_byte[ 7 ], dbl_byte[ 6 ], dbl_byte[ 5 ], dbl_byte[ 4 ], dbl_byte[ 3 ], dbl_byte[ 2 ], dbl_byte[ 1 ], dbl_byte[ 0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( double ); ++i )
    {
        assert( dbl_byte[ i ] == dbl.byte[ i ] );
    }

    /* Printing binary dump of whole register */
    printf( "Bin:  seee.eeee.eeee.ffff.ffff.ffff.ffff.ffff.\n      " );

    for ( unsigned i = sizeof( double ); i > 0; --i )
    {
        unsigned high_nibble = ( dbl_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ dbl_byte[ i - 1 ] & 0x0f ] );
        if ( ( i > 1 ) && ( i % 4 == 1 ) ) printf( "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)dbl_byte[7] & 0x7f ) << 4 ) | ( ( (unsigned)dbl_byte[6] & 0xf0 ) >> 4 );

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_DBL_BIAS );

#ifdef FLOAT80
    puts( "------------------ float80 -------------------" );

    printf( "Bits: %zu (48 unused, 80 encoded)\n", sizeof( long double ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",
            flt80_byte[ 9 ], flt80_byte[ 8 ],
            flt80_byte[ 7 ], flt80_byte[ 6 ], flt80_byte[ 5 ], flt80_byte[ 4 ],
            flt80_byte[ 3 ], flt80_byte[ 2 ], flt80_byte[ 1 ], flt80_byte[ 0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( long double ); ++i )
    {
        assert( flt80_byte[ i ] == flt80.byte[ i ] );
    }

    /* Printing binary dump of significant parts of register */
    printf( "Bin:  seee.eeee.eeee.eeee.\n      " );

    for ( unsigned i = sizeof( long double ) - 6; i > 0; --i )
    {
        unsigned high_nibble = ( flt80_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ flt80_byte[ i - 1 ] & 0x0f ] );
        if ( i == 9 ) printf( "\n      ifff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
        if ( i == 5 ) printf( "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)flt80_byte[9] & 0x7f ) << 8 ) | (unsigned)flt80_byte[8];

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_FLT80_BIAS );

    /* Printing decimal */
    printf( "Dec:  %d\n", ( (unsigned)flt80_byte[7] & 0x80 ) == 0x80 );

#endif

#ifdef FLOAT128
    puts( "----------------- float128 -------------------" );

    printf( "Bits: %zu\n", sizeof( float128_t ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",
            flt128_byte[ 15 ], flt128_byte[ 14 ], flt128_byte[ 13 ], flt128_byte[ 12 ],
            flt128_byte[ 11 ], flt128_byte[ 10 ], flt128_byte[  9 ], flt128_byte[  8 ],
            flt128_byte[  7 ], flt128_byte[  6 ], flt128_byte[  5 ], flt128_byte[  4 ],
            flt128_byte[  3 ], flt128_byte[  2 ], flt128_byte[  1 ], flt128_byte[  0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( float128_t ); ++i )
    {
        assert( flt128_byte[ i ] == flt128.byte[ i ] );
    }

    /* Printing binary dump of whole register */
    printf( "Bin:  seee.eeee.eeee.eeee.ffff.ffff.ffff.ffff.\n      " );

    for ( unsigned i = sizeof( float128_t ); i > 0; --i )
    {
        unsigned high_nibble = ( flt128_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ flt128_byte[ i - 1 ] & 0x0f ] );
        if ( ( i > 1 ) && ( i % 4 == 1 ) ) printf( "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)flt128_byte[ 15 ] & 0x7f ) << 8 ) | (unsigned)flt128_byte[ 14 ];

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_FLT128_BIAS );
#endif

    puts( "----------------------------------------------" );

    if ( argc == 3 )
    {
        char conversion[ 10 ] = "%";
        size_t len;

        if ( argv[ 2 ][ 0 ] == '%' )
        {
            ++argv[ 2 ];
        }

        if ( strlen( argv[ 2 ] ) > 8 )
        {
            puts( "Conversion too long (8 characters max)" );
            return 1;
        }

        /* Print the fp value with the conversion given */
        strcat( conversion, argv[ 2 ] );
        strcat( conversion, "\n" );
        printf( conversion, strtod( argv[ 1 ], NULL ) );

        /* Do the same with long double precision */
        len = strlen( conversion );
        memmove( conversion + len - 1, conversion + len - 2, 3 );
        conversion[ len - 2 ] = 'L';
        printf( conversion, strtold( argv[ 1 ], NULL ) );
    }
}